

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pull_by_re.c
# Opt level: O0

int pull_by_re(char *input_file,char *aStrRegex,int min,int max,int length,int exclude,int convert,
              int just_count)

{
  int iVar1;
  undefined1 local_168 [8];
  PCRE2_UCHAR8 buffer [256];
  undefined4 local_5c;
  ulong uStack_58;
  int errornumber;
  size_t erroroffset;
  pcre2_code_8 *re;
  kseq_t *seq;
  int is_fasta;
  int excluded;
  int l;
  int count;
  gzFile fp;
  int exclude_local;
  int length_local;
  int max_local;
  int min_local;
  char *aStrRegex_local;
  char *input_file_local;
  
  excluded = 0;
  seq._4_4_ = 0;
  seq._0_4_ = 0;
  fp._0_4_ = exclude;
  fp._4_4_ = length;
  exclude_local = max;
  length_local = min;
  _max_local = aStrRegex;
  aStrRegex_local = input_file;
  _l = (gzFile)gzopen(input_file,"r");
  if (_l == (gzFile)0x0) {
    fprintf(_stderr,"%s - Couldn\'t open fasta file %s\n",progname,aStrRegex_local);
    exit(1);
  }
  re = (pcre2_code_8 *)kseq_init(_l);
  is_fasta = kseq_read((kseq_t *)re);
  seq._0_4_ = (uint)(*(long *)(re + 0x58) == 0);
  gzrewind(_l);
  *(undefined4 *)(*(long *)(re + 0x68) + 0xc) = 0;
  *(undefined4 *)(*(long *)(re + 0x68) + 8) = 0;
  *(undefined4 *)(*(long *)(re + 0x68) + 0x10) = 0;
  *(undefined4 *)(re + 0x60) = 0;
  if (verbose_flag != 0) {
    if ((uint)seq == 0) {
      fprintf(_stderr,"Input is FASTQ format\n");
    }
    else {
      fprintf(_stderr,"Input is FASTA format\n");
    }
  }
  erroroffset = pcre2_compile_8(_max_local,0xffffffffffffffff,0,&local_5c,&stack0xffffffffffffffa8,0
                               );
  if (erroroffset == 0) {
    pcre2_get_error_message_8(local_5c,local_168,0x100);
    fprintf(_stderr,"PCRE2 compilation failed at offset %d: %s\n",uStack_58 & 0xffffffff,local_168);
    exit(1);
  }
  while (is_fasta = kseq_read((kseq_t *)re), -1 < is_fasta) {
    if ((int)fp == 0) {
      iVar1 = search_header((pcre2_code_8 *)erroroffset,*(char **)(re + 0x10));
      if ((iVar1 == 0) &&
         (iVar1 = search_header((pcre2_code_8 *)erroroffset,*(char **)(re + 0x28)), iVar1 == 0)) {
        seq._4_4_ = seq._4_4_ + 1;
      }
      else {
        iVar1 = size_filter((kseq_t *)re,(uint)seq,length_local,exclude_local,fp._4_4_,convert,
                            just_count);
        excluded = iVar1 + excluded;
      }
    }
    else {
      iVar1 = search_header((pcre2_code_8 *)erroroffset,*(char **)(re + 0x10));
      if ((iVar1 == 0) &&
         (iVar1 = search_header((pcre2_code_8 *)erroroffset,*(char **)(re + 0x28)), iVar1 == 0)) {
        iVar1 = size_filter((kseq_t *)re,(uint)seq,length_local,exclude_local,fp._4_4_,convert,
                            just_count);
        excluded = iVar1 + excluded;
      }
      else {
        seq._4_4_ = seq._4_4_ + 1;
      }
    }
  }
  pcre2_code_free_8(erroroffset);
  kseq_destroy((kseq_t *)re);
  gzclose(_l);
  if (just_count != 0) {
    fprintf(_stdout,"Total output: %i\n",(ulong)(uint)excluded);
    fprintf(_stdout,"Total excluded: %i\n",(ulong)seq._4_4_);
  }
  return excluded;
}

Assistant:

__KSEQ_READ(static)

/*
extern char const *progname;
extern int verbose_flag;
*/

int pull_by_re(char *input_file, char *aStrRegex, int min, int max, int length, int exclude, int convert, int just_count) {
	gzFile fp;
	int count=0,l;
	int excluded = 0;
	int is_fasta = 0; /* assume fastq */
	kseq_t *seq;

	/* pcre2 variables */
	pcre2_code *re; // the regex object
	PCRE2_SIZE erroroffset;
	int errornumber;

	/* open fasta file */
	fp = gzopen(input_file,"r");
	if (!fp) {
		fprintf(stderr,"%s - Couldn't open fasta file %s\n",progname,input_file);
		exit(EXIT_FAILURE);
	}

	seq = kseq_init(fp);

	/* determine file type */
	l = kseq_read(seq); /* read the first sequence */
	is_fasta = seq->qual.s == NULL ? 1 : 0;
	gzrewind(fp); 
	kseq_rewind(seq); /* rewind to beginning for main loop */

        if (verbose_flag) {
            if (is_fasta)
                fprintf(stderr, "Input is FASTA format\n");
            else
                fprintf(stderr, "Input is FASTQ format\n");
        }

	/* initialize the re */
	re = pcre2_compile(
			aStrRegex,             /* the pattern */
			PCRE2_ZERO_TERMINATED, /* indicates pattern is zero-terminated */
			0,                     /* default options */
			&errornumber,          /* for error num */
			&erroroffset,          /* err offset */
			NULL);                 /* default compile context */

	if (re == NULL) {
		  PCRE2_UCHAR buffer[256];
		  pcre2_get_error_message(errornumber, buffer, sizeof(buffer));
		  fprintf(stderr, "PCRE2 compilation failed at offset %d: %s\n", (int)erroroffset, buffer);
		  exit(EXIT_FAILURE);
	}

	/* search through list and see if this header matches */
	while((l = kseq_read(seq)) >= 0) {
		if (exclude) {
			if (search_header(re, seq->name.s) || search_header(re, seq->comment.s))
				excluded++;
			else {
				/* regex doesn't match, so check size/print */
				count += size_filter(seq, is_fasta, min, max, length, convert, just_count);
			}
		} else {
			if (search_header(re, seq->name.s) || search_header(re, seq->comment.s)) {
				/* regex matches so check size/print */
				count += size_filter(seq, is_fasta, min, max, length, convert, just_count);
			} else
				excluded++;
		}
	} /* end of seq traversal */

	/* tear down re */
	pcre2_code_free(re); /* free up the re */

	kseq_destroy(seq);
	gzclose(fp); /* done reading file so close */

	if (just_count) {
		fprintf(stdout, "Total output: %i\n", count);
		fprintf(stdout, "Total excluded: %i\n", excluded);
	}
	return count;
}